

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::GenStoreShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<int,_4> *write_value)

{
  ostream *poVar1;
  string *psVar2;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  GLenum e_06;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  ostringstream os;
  string local_3e8;
  string local_3c8;
  char *local_3a8;
  undefined8 local_3a0;
  undefined2 local_398;
  undefined6 uStack_396;
  string local_388;
  char *local_368;
  undefined8 local_360;
  undefined2 local_358;
  undefined6 uStack_356;
  string local_348;
  char *local_328;
  undefined8 local_320;
  undefined2 local_318;
  undefined6 uStack_316;
  string local_308;
  char *local_2e8;
  undefined8 local_2e0;
  undefined2 local_2d8;
  undefined6 uStack_2d6;
  string local_2c8;
  char *local_2a8;
  undefined8 local_2a0;
  undefined2 local_298;
  undefined6 uStack_296;
  string local_288;
  char *local_268;
  undefined8 local_260;
  undefined2 local_258;
  undefined6 uStack_256;
  string local_248;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined6 uStack_1f6;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 420 core",0x11);
  uVar5 = (uint)this;
  if (uVar5 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n#extension GL_ARB_compute_shader : require",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nlayout(",8);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_248,(void *)(ulong)(uint)stage,e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_268 = (char *)&local_258;
  local_258 = 0x69;
  local_260 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image1D g_image_1d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_288,(void *)(ulong)(uint)stage,e_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_2a8 = (char *)&local_298;
  local_298 = 0x69;
  local_2a0 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image2D g_image_2d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2c8,(void *)(ulong)(uint)stage,e_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_2e8 = (char *)&local_2d8;
  local_2d8 = 0x69;
  local_2e0 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image3D g_image_3d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_308,(void *)(ulong)(uint)stage,e_02);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_328 = (char *)&local_318;
  local_318 = 0x69;
  local_320 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_328,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image2DRect g_image_2drect;\nlayout(",0x23);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_348,(void *)(ulong)(uint)stage,e_03);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_348._M_dataplus._M_p,local_348._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_368 = (char *)&local_358;
  local_358 = 0x69;
  local_360 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_368,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"imageCube g_image_cube;\nlayout(",0x1f)
  ;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_388,(void *)(ulong)(uint)stage,e_04);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_3a8 = (char *)&local_398;
  local_398 = 0x69;
  local_3a0 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3a8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image1DArray g_image_1darray;\nlayout(",0x25);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_3c8,(void *)(ulong)(uint)stage,e_05);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_1b8 = 0x69;
  local_1c0 = 1;
  local_1c8 = (char *)&local_1b8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image2DArray g_image_2darray;\nlayout(",0x25);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_3e8,(void *)(ulong)(uint)stage,e_06);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") writeonly uniform ",0x14);
  local_1d8 = 0x69;
  local_1e0 = 1;
  local_1e8 = (char *)&local_1d8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"imageCubeArray g_image_cube_array;\nuniform ",0x2b);
  local_1f8 = 0x69;
  local_200 = 1;
  local_208 = (char *)&local_1f8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"vec4 g_value = ",0xf);
  local_218 = 0x69;
  local_220 = 1;
  local_228 = (char *)&local_218;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"vec4",4);
  poVar1 = tcu::operator<<(poVar1,(Vector<int,_4> *)CONCAT44(in_register_0000000c,internalformat));
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,";\nuniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);",0x33);
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8 != (char *)&local_398) {
    operator_delete(local_3a8,CONCAT62(uStack_396,local_398) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != (char *)&local_358) {
    operator_delete(local_368,CONCAT62(uStack_356,local_358) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (char *)&local_318) {
    operator_delete(local_328,CONCAT62(uStack_316,local_318) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != (char *)&local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,local_2d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != (char *)&local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,local_298) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != (char *)&local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,local_258) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (uVar5 < 4) {
    pcVar4 = (&PTR_anon_var_dwarf_4d48e1_020e5b90)[(ulong)this & 0xffffffff];
    lVar3 = *(long *)(&DAT_01a811b0 + ((ulong)this & 0xffffffff) * 8);
  }
  else {
    if (uVar5 != 4) goto LAB_009c6be2;
    lVar3 = 0x67;
    pcVar4 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar3);
LAB_009c6be2:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n  imageStore(g_image_1d, coord.x, g_value);\n  imageStore(g_image_2d, coord, g_value);\n  imageStore(g_image_3d, ivec3(coord.xy, g_index[0]), g_value);\n  imageStore(g_image_3d, ivec3(coord.xy, g_index[1]), g_value);\n  imageStore(g_image_2drect, coord, g_value);\n  for (int i = 0; i < 6; ++i) {\n    imageStore(g_image_cube, ivec3(coord, g_index[i]), g_value);\n  }\n  imageStore(g_image_1darray, ivec2(coord.x, g_index[0]), g_value);\n  imageStore(g_image_1darray, ivec2(coord.x, g_index[1]), g_value);\n  imageStore(g_image_2darray, ivec3(coord, g_index[0]), g_value);\n  imageStore(g_image_2darray, ivec3(coord, g_index[1]), g_value);\n  for (int i = 0; i < 6; ++i) {\n    imageStore(g_image_cube_array, ivec3(coord, g_index[i]), g_value);\n  }\n  for (int i = 0; i < 6; ++i) {\n    imageStore(g_image_cube_array, ivec3(coord, g_index[i] + 6), g_value);\n  }\n}"
             ,0x351);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string GenStoreShader(int stage, GLenum internalformat, const T& write_value)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "image1D g_image_1d;" NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform "
		   << TypePrefix<T>() << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>() << "image3D g_image_3d;" NL "layout("
		   << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "image2DRect g_image_2drect;" NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform "
		   << TypePrefix<T>() << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>() << "imageCubeArray g_image_cube_array;" NL "uniform "
		   << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4" << write_value
		   << ";" NL "uniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  imageStore(g_image_1d, coord.x, g_value);" NL "  imageStore(g_image_2d, coord, g_value);" NL
				 "  imageStore(g_image_3d, ivec3(coord.xy, g_index[0]), g_value);" NL
				 "  imageStore(g_image_3d, ivec3(coord.xy, g_index[1]), g_value);" NL
				 "  imageStore(g_image_2drect, coord, g_value);" NL "  for (int i = 0; i < 6; ++i) {" NL
				 "    imageStore(g_image_cube, ivec3(coord, g_index[i]), g_value);" NL "  }" NL
				 "  imageStore(g_image_1darray, ivec2(coord.x, g_index[0]), g_value);" NL
				 "  imageStore(g_image_1darray, ivec2(coord.x, g_index[1]), g_value);" NL
				 "  imageStore(g_image_2darray, ivec3(coord, g_index[0]), g_value);" NL
				 "  imageStore(g_image_2darray, ivec3(coord, g_index[1]), g_value);" NL
				 "  for (int i = 0; i < 6; ++i) {" NL
				 "    imageStore(g_image_cube_array, ivec3(coord, g_index[i]), g_value);" NL "  }" NL
				 "  for (int i = 0; i < 6; ++i) {" NL
				 "    imageStore(g_image_cube_array, ivec3(coord, g_index[i] + 6), g_value);" NL "  }" NL "}";
		return os.str();
	}